

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O0

bool __thiscall
GeneratedSaxParser::ParserTemplateBase::handleError
          (ParserTemplateBase *this,Severity severity,ErrorType errorType,StringHash attributeHash,
          ParserChar *additionalText)

{
  bool bVar1;
  StringHash in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
  *in_R8;
  ParserTemplateBase *unaff_retaddr;
  StringHash elementHash;
  
  bVar1 = std::
          deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ::empty((deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   *)0xc589ee);
  if (!bVar1) {
    std::
    deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
    ::back(in_R8);
  }
  bVar1 = handleError(unaff_retaddr,(Severity)((ulong)in_RDI >> 0x20),(ErrorType)in_RDI,
                      CONCAT44(in_ESI,in_EDX),in_RCX,(ParserChar *)in_R8);
  return bVar1;
}

Assistant:

bool ParserTemplateBase::handleError( ParserError::Severity severity,
												 ParserError::ErrorType errorType,
												 StringHash attributeHash,
												 const ParserChar* additionalText )
	{
		StringHash elementHash = mElementDataStack.empty() ? 0 : mElementDataStack.back().elementHash;

		return handleError(severity,
			errorType,
			elementHash,
			attributeHash,
			additionalText);
	}